

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O1

char * nv::Path::extension(char *str)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((str == (char *)0x0) &&
     (iVar1 = nvAbort("str != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x213,"static const char *nv::Path::extension(const char *)"), iVar1 == 1)) {
    raise(5);
  }
  sVar3 = strlen(str);
  uVar2 = (uint)sVar3;
  uVar6 = sVar3 & 0xffffffff;
  while ((uVar5 = (uint)uVar6, uVar4 = (int)uVar2 >> 0x1f & uVar2, 0 < (int)uVar5 &&
         (uVar4 = uVar5, str[uVar6] != '.'))) {
    uVar6 = (ulong)(uVar5 - 1);
    if (str[uVar6] == '/') {
LAB_001d1a4f:
      uVar4 = uVar2;
LAB_001d1a51:
      return str + (int)uVar4;
    }
  }
  if (uVar4 != 0) goto LAB_001d1a51;
  goto LAB_001d1a4f;
}

Assistant:

const char * Path::extension(const char * str)
{
	nvCheck( str != NULL );

	int length, l;
	l = length = (int)strlen( str );
	while( length > 0 && str[length] != '.' ) {
		length--;
		if( str[length] == separator() ) {
			return &str[l];		// no extension
		}
	}
	if( length == 0 ) {
		return &str[l];
	}
	return &str[length];
}